

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYRef<double>,_ImPlot::GetterXsYRef<double>,_ImPlot::TransformerLogLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYRef<double>,_ImPlot::GetterXsYRef<double>,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  TransformerLogLog *pTVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar5 [16];
  ImPlotPoint IVar6;
  ImVec2 P2;
  ImVec2 P1;
  ImVec2 local_68;
  ImVec2 local_60;
  ImRect local_58;
  undefined1 local_48 [16];
  
  pTVar1 = this->Transformer;
  IVar6 = GetterXsYRef<double>::operator()(this->Getter1,prim);
  local_58.Max = (ImVec2)IVar6.y;
  local_58.Min = (ImVec2)IVar6.x;
  local_60 = TransformerLogLog::operator()(pTVar1,(ImPlotPoint *)&local_58);
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_4_ = local_60.x;
  local_48._4_4_ = local_60.y;
  local_48._12_4_ = extraout_XMM0_Dd;
  pTVar1 = this->Transformer;
  IVar6 = GetterXsYRef<double>::operator()(this->Getter2,prim);
  local_58.Max = (ImVec2)IVar6.y;
  local_58.Min = (ImVec2)IVar6.x;
  local_68 = TransformerLogLog::operator()(pTVar1,(ImPlotPoint *)&local_58);
  auVar5._8_4_ = extraout_XMM0_Dc_00;
  auVar5._0_4_ = local_68.x;
  auVar5._4_4_ = local_68.y;
  auVar5._12_4_ = extraout_XMM0_Dd_00;
  auVar5 = minps(local_48,auVar5);
  uVar3 = -(uint)(local_68.x <= local_48._0_4_);
  uVar4 = -(uint)(local_68.y <= local_48._4_4_);
  local_58.Max = (ImVec2)(CONCAT44(~uVar4 & (uint)local_68.y,~uVar3 & (uint)local_68.x) |
                         CONCAT44((uint)local_48._4_4_ & uVar4,(uint)local_48._0_4_ & uVar3));
  local_58.Min = auVar5._0_8_;
  bVar2 = ImRect::Overlaps(cull_rect,&local_58);
  if (bVar2) {
    AddLine(&local_60,&local_68,this->Weight,this->Col,DrawList,*uv);
  }
  return bVar2;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }